

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util.cc
# Opt level: O3

bool EqualsCaseInsensitiveASCII(StringPiece a,StringPiece b)

{
  char cVar1;
  long lVar2;
  size_t sVar3;
  char cVar4;
  char cVar5;
  bool bVar6;
  
  sVar3 = a.len_;
  if (sVar3 != b.len_) {
    return false;
  }
  if (sVar3 != 0) {
    lVar2 = 0;
    do {
      cVar1 = a.str_[lVar2];
      cVar4 = cVar1 + ' ';
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        cVar4 = cVar1;
      }
      cVar1 = b.str_[lVar2];
      cVar5 = cVar1 + ' ';
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        cVar5 = cVar1;
      }
    } while ((cVar4 == cVar5) && (bVar6 = sVar3 - 1 != lVar2, lVar2 = lVar2 + 1, bVar6));
    return cVar4 == cVar5;
  }
  return true;
}

Assistant:

bool EqualsCaseInsensitiveASCII(StringPiece a, StringPiece b) {
  if (a.len_ != b.len_) {
    return false;
  }

  for (size_t i = 0; i < a.len_; ++i) {
    if (ToLowerASCII(a.str_[i]) != ToLowerASCII(b.str_[i])) {
      return false;
    }
  }

  return true;
}